

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

void Gia_ManPrepareLastTwo(Gia_Man_t *pNew,Vec_Int_t *vSuper)

{
  uint i;
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  
  iVar8 = vSuper->nSize;
  if (iVar8 != 2) {
    if (iVar8 < 3) {
      __assert_fail("nSize > 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                    ,0xe8,"void Gia_ManPrepareLastTwo(Gia_Man_t *, Vec_Int_t *)");
    }
    i = iVar8 - 2;
    iVar2 = Vec_IntEntry(vSuper,i);
    iVar2 = Abc_Lit2Var(iVar2);
    iVar3 = Gia_ObjLevelId(pNew,iVar2);
    for (iVar2 = iVar8 + -3; iVar4 = -1, -1 < iVar2; iVar2 = iVar2 + -1) {
      iVar4 = Vec_IntEntry(vSuper,iVar2);
      iVar4 = Abc_Lit2Var(iVar4);
      iVar5 = Gia_ObjLevelId(pNew,iVar4);
      iVar4 = iVar2;
      if (iVar3 != iVar5) break;
    }
    if (iVar4 != iVar8 + -3) {
      iVar2 = iVar8 + -9;
      if (iVar8 + -9 < iVar4) {
        iVar2 = iVar4;
      }
      uVar13 = iVar8 - 1;
      iVar8 = 0;
      lVar11 = (long)(int)uVar13;
      lVar9 = lVar11;
      for (lVar12 = lVar11; lVar9 = lVar9 + -1, lVar10 = lVar9, iVar3 = iVar8, iVar2 < lVar12;
          lVar12 = lVar12 + -1) {
        for (; iVar2 < lVar10; lVar10 = lVar10 + -1) {
          iVar4 = Vec_IntEntry(vSuper,(int)lVar12);
          iVar5 = Vec_IntEntry(vSuper,i + iVar3);
          iVar6 = Abc_Lit2Var(iVar4);
          iVar7 = Abc_Lit2Var(iVar5);
          if ((iVar6 == iVar7) || (iVar4 = Gia_ManHashLookupInt(pNew,iVar4,iVar5), iVar4 != 0)) {
            piVar1 = vSuper->pArray;
            if (lVar12 != lVar11) {
              iVar4 = piVar1[lVar12];
              piVar1[lVar12] = piVar1[uVar13];
              piVar1[uVar13] = iVar4;
            }
            if (iVar3 != 0) {
              iVar4 = piVar1[lVar10];
              piVar1[lVar10] = piVar1[i];
              piVar1[i] = iVar4;
            }
          }
          iVar3 = iVar3 + -1;
        }
        iVar8 = iVar8 + -1;
      }
    }
  }
  return;
}

Assistant:

void Gia_ManPrepareLastTwo( Gia_Man_t * pNew, Vec_Int_t * vSuper )
{
    int i, k, Stop, Lit1, Lit2, Level1, Level2, * pArray;
    int nSize = Vec_IntSize(vSuper);
    if ( nSize == 2 )
        return;
    assert( nSize > 2 );
    Level1 = Gia_ObjLevelId( pNew, Abc_Lit2Var(Vec_IntEntry(vSuper, nSize-2)) );
    // find the first one with Level1
    for ( Stop = nSize-3; Stop >= 0; Stop-- )
    {
        Level2 = Gia_ObjLevelId( pNew, Abc_Lit2Var(Vec_IntEntry(vSuper, Stop)) );
        if ( Level1 != Level2 )
            break;
    }
    if ( Stop == nSize-3 )
        return;
    // avoid worst-case quadratic behavior by looking at the last 8 nodes
    Stop = Abc_MaxInt( Stop, nSize - 9 );
    for ( i = nSize - 1; i > Stop; i-- )
        for ( k = i - 1; k > Stop; k-- )
        {
            Lit1 = Vec_IntEntry(vSuper, i);
            Lit2 = Vec_IntEntry(vSuper, k);
            if ( Abc_Lit2Var(Lit1) != Abc_Lit2Var(Lit2) && !Gia_ManHashLookupInt(pNew, Lit1, Lit2) ) // new node
                continue;
            // move Lit1 to be last and Lit2 to be the one before
            pArray = Vec_IntArray( vSuper );
            if ( i != nSize-1 )
                ABC_SWAP( int, pArray[i], pArray[nSize-1] );
            if ( k != nSize-2 )
                ABC_SWAP( int, pArray[k], pArray[nSize-2] );
        }
}